

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void computeLimitRegisters(Parse *pParse,Select *p,int iBreak)

{
  short sVar1;
  Expr *pEVar2;
  LogEst LVar3;
  int iVar4;
  Expr *pLimit;
  int local_30;
  int n;
  int iOffset;
  int iLimit;
  Vdbe *v;
  Select *pSStack_18;
  int iBreak_local;
  Select *p_local;
  Parse *pParse_local;
  
  _iOffset = (Vdbe *)0x0;
  pEVar2 = p->pLimit;
  if ((p->iLimit == 0) && (pEVar2 != (Expr *)0x0)) {
    n = pParse->nMem + 1;
    pParse->nMem = n;
    p->iLimit = n;
    v._4_4_ = iBreak;
    pSStack_18 = p;
    p_local = (Select *)pParse;
    _iOffset = sqlite3GetVdbe(pParse);
    iVar4 = sqlite3ExprIsInteger(pEVar2->pLeft,(int *)((long)&pLimit + 4));
    if (iVar4 == 0) {
      sqlite3ExprCode((Parse *)p_local,pEVar2->pLeft,n);
      sqlite3VdbeAddOp1(_iOffset,0xc,n);
      sqlite3VdbeAddOp2(_iOffset,0x10,n,v._4_4_);
    }
    else {
      sqlite3VdbeAddOp2(_iOffset,0x47,pLimit._4_4_,n);
      if (pLimit._4_4_ == 0) {
        sqlite3VdbeGoto(_iOffset,v._4_4_);
      }
      else if ((-1 < pLimit._4_4_) &&
              (sVar1 = pSStack_18->nSelectRow, LVar3 = sqlite3LogEst((long)pLimit._4_4_),
              LVar3 < sVar1)) {
        LVar3 = sqlite3LogEst((long)pLimit._4_4_);
        pSStack_18->nSelectRow = LVar3;
        pSStack_18->selFlags = pSStack_18->selFlags | 0x4000;
      }
    }
    if (pEVar2->pRight != (Expr *)0x0) {
      local_30 = *(int *)&p_local->pGroupBy + 1;
      *(int *)&p_local->pGroupBy = local_30;
      pSStack_18->iOffset = local_30;
      *(int *)&p_local->pGroupBy = *(int *)&p_local->pGroupBy + 1;
      sqlite3ExprCode((Parse *)p_local,pEVar2->pRight,local_30);
      sqlite3VdbeAddOp1(_iOffset,0xc,local_30);
      sqlite3VdbeAddOp3(_iOffset,0xa0,n,local_30 + 1,local_30);
    }
  }
  return;
}

Assistant:

static void computeLimitRegisters(Parse *pParse, Select *p, int iBreak){
  Vdbe *v = 0;
  int iLimit = 0;
  int iOffset;
  int n;
  Expr *pLimit = p->pLimit;

  if( p->iLimit ) return;

  /*
  ** "LIMIT -1" always shows all rows.  There is some
  ** controversy about what the correct behavior should be.
  ** The current implementation interprets "LIMIT 0" to mean
  ** no rows.
  */
  if( pLimit ){
    assert( pLimit->op==TK_LIMIT );
    assert( pLimit->pLeft!=0 );
    p->iLimit = iLimit = ++pParse->nMem;
    v = sqlite3GetVdbe(pParse);
    assert( v!=0 );
    if( sqlite3ExprIsInteger(pLimit->pLeft, &n) ){
      sqlite3VdbeAddOp2(v, OP_Integer, n, iLimit);
      VdbeComment((v, "LIMIT counter"));
      if( n==0 ){
        sqlite3VdbeGoto(v, iBreak);
      }else if( n>=0 && p->nSelectRow>sqlite3LogEst((u64)n) ){
        p->nSelectRow = sqlite3LogEst((u64)n);
        p->selFlags |= SF_FixedLimit;
      }
    }else{
      sqlite3ExprCode(pParse, pLimit->pLeft, iLimit);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, iLimit); VdbeCoverage(v);
      VdbeComment((v, "LIMIT counter"));
      sqlite3VdbeAddOp2(v, OP_IfNot, iLimit, iBreak); VdbeCoverage(v);
    }
    if( pLimit->pRight ){
      p->iOffset = iOffset = ++pParse->nMem;
      pParse->nMem++;   /* Allocate an extra register for limit+offset */
      sqlite3ExprCode(pParse, pLimit->pRight, iOffset);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, iOffset); VdbeCoverage(v);
      VdbeComment((v, "OFFSET counter"));
      sqlite3VdbeAddOp3(v, OP_OffsetLimit, iLimit, iOffset+1, iOffset);
      VdbeComment((v, "LIMIT+OFFSET"));
    }
  }
}